

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

MemoryPoolAllocator<rapidjson::CrtAllocator> * __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::GetAllocator(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               *this)

{
  RapidJSONException *this_00;
  
  if (this->allocator_ != (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
    return this->allocator_;
  }
  this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
  cereal::RapidJSONException::RapidJSONException
            (this_00,"rapidjson internal assertion failure: allocator_");
  __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Allocator& GetAllocator() {
        CEREAL_RAPIDJSON_ASSERT(allocator_);
        return *allocator_;
    }